

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O1

void merge_lcp_2way_unstable<false>
               (uchar **from0,lcp_t *lcp_input0,size_t n0,uchar **from1,lcp_t *lcp_input1,size_t n1,
               uchar **result,lcp_t *lcp_result)

{
  undefined8 *puVar1;
  char *pcVar2;
  uchar *puVar3;
  uchar *__s1;
  int iVar4;
  ulong uVar5;
  lcp_t *plVar6;
  long lVar7;
  lcp_t *plVar8;
  uchar **ppuVar9;
  uchar **__dest;
  char cVar10;
  uchar **ppuVar11;
  size_t sVar12;
  bool bVar13;
  lcp_t lcp01;
  size_t local_78;
  lcp_t local_70;
  lcp_t *local_68;
  lcp_t *local_58;
  lcp_t local_48;
  lcp_t local_40;
  int local_38;
  
  check_input(from0,lcp_input0,n0);
  check_input(from1,lcp_input1,n1);
  compare((uchar *)&local_40,*from0,(size_t)*from1);
  local_48 = local_40;
  __dest = result + 1;
  if (local_38 < 1) {
    puVar3 = *from0;
    from0 = from0 + 1;
    *result = puVar3;
    local_68 = lcp_input0 + 1;
    local_78 = n0 - 1;
    plVar6 = &local_48;
    plVar8 = lcp_input0;
    local_58 = lcp_input1;
  }
  else {
    *result = *from1;
    n1 = n1 - 1;
    local_78 = n0;
    if (n1 == 0) {
LAB_001c7cb6:
      bVar13 = true;
LAB_001c7cbc:
      if (!bVar13) {
        __assert_fail("not n1",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x684,
                      "void merge_lcp_2way_unstable(unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict) [OutputLCP = false]"
                     );
      }
      goto joined_r0x001c7cff;
    }
    from1 = from1 + 1;
    local_58 = lcp_input1 + 1;
    plVar8 = &local_48;
    plVar6 = lcp_input1;
    local_68 = lcp_input0;
  }
  uVar5 = *plVar6;
  local_70 = *plVar8;
LAB_001c79d1:
  do {
    ppuVar11 = from1;
    ppuVar9 = __dest;
    lVar7 = 0;
    while( true ) {
      check_lcps(*(uchar **)((long)ppuVar9 + lVar7 + -8),*from0,local_70,
                 *(uchar **)((long)ppuVar11 + lVar7),uVar5);
      if (uVar5 < local_70) break;
      if (uVar5 <= local_70) {
        from1 = (uchar **)((long)ppuVar11 + lVar7);
        compare((uchar *)&local_40,*from0,*(size_t *)((long)ppuVar11 + lVar7));
        plVar6 = (lcp_t *)((long)local_58 + lVar7);
        if (local_38 < 0) {
          puVar3 = *from0;
          from0 = from0 + 1;
          __dest = (uchar **)((undefined8 *)((long)ppuVar9 + lVar7) + 1);
          *(undefined8 *)((long)ppuVar9 + lVar7) = puVar3;
          local_78 = local_78 - 1;
          uVar5 = local_40;
          if (local_78 == 0) {
            cVar10 = '\x02';
            local_78 = 0;
            sVar12 = n1;
          }
          else {
            local_70 = *local_68;
            local_68 = local_68 + 1;
LAB_001c7c5a:
            cVar10 = '\0';
            sVar12 = n1;
          }
        }
        else {
          puVar3 = *from1;
          if (local_38 == 0) {
            __s1 = *from0;
            if (__s1 == (uchar *)0x0) goto LAB_001c7d1c;
            if (puVar3 == (uchar *)0x0) goto LAB_001c7d3b;
            iVar4 = strcmp((char *)__s1,(char *)puVar3);
            if (iVar4 != 0) {
              __assert_fail("cmp(*from0, *from1)==0",
                            "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                            ,0x664,
                            "void merge_lcp_2way_unstable(unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict) [OutputLCP = false]"
                           );
            }
            if (local_78 == 0) {
              pcVar2 = "not n0";
LAB_001c7de6:
              __assert_fail(pcVar2 + 4,
                            "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                            ,0x665,
                            "void merge_lcp_2way_unstable(unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict) [OutputLCP = false]"
                           );
            }
            if (n1 == 0) {
              pcVar2 = "not n1";
              goto LAB_001c7de6;
            }
            from0 = from0 + 1;
            puVar1 = (undefined8 *)(lVar7 + (long)ppuVar9);
            __dest = (uchar **)(puVar1 + 2);
            *puVar1 = __s1;
            from1 = (uchar **)((long)ppuVar11 + lVar7 + 8);
            puVar1[1] = from1[-1];
            sVar12 = n1 - 1;
            local_70 = *local_68;
            plVar6 = (lcp_t *)((long)local_58 + lVar7) + 1;
            uVar5 = *(lcp_t *)((long)local_58 + lVar7);
            local_78 = local_78 - 1;
            if (local_78 == 0) {
              cVar10 = '\x02';
              local_78 = 0;
              local_68 = local_68 + 1;
            }
            else {
              cVar10 = (n1 == 1) * '\x03';
              local_68 = local_68 + 1;
            }
          }
          else {
            from1 = (uchar **)((long)ppuVar11 + lVar7 + 8);
            __dest = (uchar **)((undefined8 *)((long)ppuVar9 + lVar7) + 1);
            *(undefined8 *)((long)ppuVar9 + lVar7) = puVar3;
            if (n1 != 1) {
              n1 = n1 - 1;
              plVar6 = (lcp_t *)((long)local_58 + lVar7) + 1;
              local_70 = local_40;
              uVar5 = *(lcp_t *)((long)local_58 + lVar7);
              goto LAB_001c7c5a;
            }
            cVar10 = '\x03';
            local_70 = local_40;
            sVar12 = 0;
          }
        }
        n1 = sVar12;
        local_58 = plVar6;
        if (cVar10 == '\0') goto LAB_001c79d1;
        if (cVar10 == '\x01') {
          return;
        }
        if (cVar10 != '\x03') goto LAB_001c7cf3;
        bVar13 = sVar12 == 0;
        goto LAB_001c7cbc;
      }
      if (*from0 == (uchar *)0x0) goto LAB_001c7d1c;
      pcVar2 = *(char **)((long)ppuVar11 + lVar7);
      if (pcVar2 == (char *)0x0) goto LAB_001c7d3b;
      iVar4 = strcmp((char *)*from0,pcVar2);
      if (iVar4 < 1) {
        __assert_fail("cmp(*from0, *from1) > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x655,
                      "void merge_lcp_2way_unstable(unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict) [OutputLCP = false]"
                     );
      }
      *(char **)((long)ppuVar9 + lVar7) = pcVar2;
      uVar5 = *(ulong *)((long)local_58 + lVar7);
      lVar7 = lVar7 + 8;
      n1 = n1 - 1;
      if (n1 == 0) {
        __dest = (uchar **)((long)ppuVar9 + lVar7);
        goto LAB_001c7cb6;
      }
    }
    puVar3 = *from0;
    if (puVar3 == (uchar *)0x0) {
LAB_001c7d1c:
      __assert_fail("a != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x51,"int cmp(const unsigned char *, const unsigned char *)");
    }
    if (*(char **)((long)ppuVar11 + lVar7) == (char *)0x0) {
LAB_001c7d3b:
      __assert_fail("b != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x52,"int cmp(const unsigned char *, const unsigned char *)");
    }
    iVar4 = strcmp((char *)puVar3,*(char **)((long)ppuVar11 + lVar7));
    if (-1 < iVar4) {
      __assert_fail("cmp(*from0, *from1) < 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x64f,
                    "void merge_lcp_2way_unstable(unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict) [OutputLCP = false]"
                   );
    }
    local_58 = (lcp_t *)((long)local_58 + lVar7);
    from0 = from0 + 1;
    *(undefined8 *)(lVar7 + (long)ppuVar9) = puVar3;
    local_70 = *local_68;
    local_68 = local_68 + 1;
    local_78 = local_78 - 1;
    __dest = (uchar **)((undefined8 *)(lVar7 + (long)ppuVar9) + 1);
    from1 = (uchar **)((long)ppuVar11 + lVar7);
  } while (local_78 != 0);
  from1 = (uchar **)((long)ppuVar11 + lVar7);
  __dest = (uchar **)((long)ppuVar9 + lVar7 + 8);
  local_78 = 0;
LAB_001c7cf3:
  bVar13 = local_78 != 0;
  from0 = from1;
  local_78 = n1;
  if (bVar13) {
    __assert_fail("not n0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                  ,0x67b,
                  "void merge_lcp_2way_unstable(unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict) [OutputLCP = false]"
                 );
  }
joined_r0x001c7cff:
  if (local_78 == 0) {
    return;
  }
  memmove(__dest,from0,local_78 << 3);
  return;
}

Assistant:

static void
merge_lcp_2way_unstable(
               unsigned char** from0,  lcp_t* restrict lcp_input0, size_t n0,
               unsigned char** from1,  lcp_t* restrict lcp_input1, size_t n1,
               unsigned char** result, lcp_t* restrict lcp_result)
{
	debug() << __func__ << "(): n0=" << n0 << ", n1=" << n1 << '\n';
	check_input(from0, lcp_input0, n0);
	check_input(from1, lcp_input1, n1);
	lcp_t lcp0=0, lcp1=0;
	int cmp01; lcp_t lcp01;
	std::tie(cmp01, lcp01) = compare(*from0, *from1);
	if (cmp01 <= 0) {
		*result++ = *from0++;
		lcp0 = *lcp_input0++;
		lcp1 = lcp01;
		if (--n0 == 0) goto finish0;
	} else {
		*result++ = *from1++;
		lcp1 = *lcp_input1++;
		lcp0 = lcp01;
		if (--n1 == 0) goto finish1;
	}
	while (true) {
		debug() << "Starting loop, n0="<<n0<<", n1="<<n1<<" ...\n"
		        << "\tprev  = '" <<*(result-1)<<"'\n"
		        << "\tfrom0 = '"<<*from0<<"'\n"
		        << "\tfrom1 = '"<<*from1<<"'\n"
		        << "\tlcp0  = " << lcp0 << "\n"
		        << "\tlcp1  = " << lcp1 << "\n"
		        << "\n";
		check_lcps(*(result-1),*from0,lcp0,*from1,lcp1);
		if (lcp0 > lcp1) {
			assert(cmp(*from0, *from1) < 0);
			*result++ = *from0++;
			if (OutputLCP) *lcp_result++ = lcp0;
			lcp0 = *lcp_input0++;
			if (--n0 == 0) goto finish0;
		} else if (lcp0 < lcp1) {
			assert(cmp(*from0, *from1) > 0);
			*result++ = *from1++;
			if (OutputLCP) *lcp_result++ = lcp1;
			lcp1 = *lcp_input1++;
			if (--n1 == 0) goto finish1;
		} else {
			int cmp01; lcp_t lcp01;
			std::tie(cmp01,lcp01) = compare(*from0, *from1, lcp0);
			if (cmp01 < 0) {
				*result++ = *from0++;
				if (OutputLCP) *lcp_result++ = lcp0;
				lcp1 = lcp01;
				if (--n0 == 0) goto finish0;
				lcp0 = *lcp_input0++;
			} else if (cmp01 == 0) {
				assert(cmp(*from0, *from1)==0);
				assert(n0); assert(n1);
				if (OutputLCP) *lcp_result++ = lcp0;
				if (OutputLCP) *lcp_result++ = lcp01;
				*result++ = *from0++;
				*result++ = *from1++;
				--n0;
				--n1;
				lcp0 = *lcp_input0++;
				lcp1 = *lcp_input1++;
				if (n0 == 0) goto finish0;
				if (n1 == 0) goto finish1;
			} else {
				*result++ = *from1++;
				if (OutputLCP) *lcp_result++ = lcp0;
				lcp0 = lcp01;
				if (--n1 == 0) goto finish1;
				lcp1 = *lcp_input1++;
			}
		}
	}
finish0:
	debug() << '~' << __func__ << "(): n0=" << n0 << ", n1=" << n1 << '\n';
	assert(not n0);
	if (n1) {
		std::copy(from1, from1+n1, result);
		if (OutputLCP) *lcp_result++ = lcp1;
		if (OutputLCP) std::copy(lcp_input1, lcp_input1+n1, lcp_result);
	}
	return;
finish1:
	debug() << '~' << __func__ << "(): n0=" << n0 << ", n1=" << n1 << '\n';
	assert(not n1);
	if (n0) {
		std::copy(from0, from0+n0, result);
		if (OutputLCP) *lcp_result++ = lcp0;
		if (OutputLCP) std::copy(lcp_input0, lcp_input0+n0, lcp_result);
	}
	return;
}